

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brent.c
# Opt level: O0

double brent_zero(custom_funcuni *funcuni,double ai,double bi,double tol,double eps)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  int iter;
  double r;
  double q;
  double p;
  double fd;
  double etol;
  double s;
  double m;
  double fc;
  double fb;
  double fa;
  double e;
  double d;
  double c;
  double b;
  double a;
  double bz;
  double eps_local;
  double tol_local;
  double bi_local;
  double ai_local;
  custom_funcuni *funcuni_local;
  
  fb = (*funcuni->funcuni)(ai,funcuni->params);
  dVar3 = (*funcuni->funcuni)(bi,funcuni->params);
  fa = bi - ai;
  fc = dVar3;
  c = bi;
  b = ai;
  if (ABS(fb) < ABS(dVar3)) {
    fc = fb;
    fb = dVar3;
    c = ai;
    b = bi;
  }
  dVar3 = eps * 2.0 * ABS(c);
  dVar6 = b - c;
  a = c;
  m = fb;
  e = fa;
  d = b;
  while( true ) {
    dVar2 = c;
    dVar1 = fa;
    s = dVar6 * 0.5;
    fd = dVar3 + tol;
    if (ABS(s) < fd || fc == 0.0) break;
    if ((ABS(fa) < fd) || (ABS(fb) <= ABS(fc))) {
      fa = s;
      e = s;
    }
    else {
      dVar3 = fc / fb;
      if ((b != d) || (NAN(b) || NAN(d))) {
        dVar4 = fb / m;
        dVar5 = fc / m;
        dVar6 = s * 2.0 * dVar4 * (dVar4 - dVar5) + -((c - b) * (dVar5 - 1.0));
        r = (dVar4 - 1.0) * (dVar5 - 1.0) * (dVar3 - 1.0);
      }
      else {
        dVar6 = s * 2.0;
        r = 1.0 - dVar3;
      }
      q = dVar6 * dVar3;
      if (q <= 0.0) {
        q = -q;
      }
      else {
        r = -r;
      }
      fa = e;
      if ((s * 3.0 * r + -ABS(fd * r) <= q * 2.0) || (ABS(dVar1 * 0.5 * r) <= q)) {
        fa = s;
        e = s;
      }
      else {
        e = q / r;
      }
    }
    b = c;
    fb = fc;
    if (ABS(e) <= fd) {
      if (s <= 0.0) {
        c = c - fd;
      }
      else {
        c = fd + c;
      }
    }
    else {
      c = e + c;
    }
    dVar3 = c;
    dVar6 = (*funcuni->funcuni)(c,funcuni->params);
    a = c;
    if (((0.0 < dVar6) && (0.0 < m)) || ((dVar6 <= 0.0 && (m <= 0.0)))) {
      d = dVar2;
      m = fc;
      fa = c - dVar2;
      e = fa;
    }
    fc = dVar6;
    if (ABS(m) < ABS(dVar6)) {
      b = c;
      c = d;
      d = dVar3;
      fc = m;
      m = dVar6;
      fb = dVar6;
    }
    dVar3 = eps * 2.0 * ABS(c);
    dVar6 = d - c;
  }
  return a;
}

Assistant:

double brent_zero(custom_funcuni *funcuni, double ai, double bi, double tol, double eps) {
	double bz;
	double a,b,c,d,e,fa,fb,fc;
	double m,s,etol,fd,p,q,r;
	int iter;
	
	fd = eps;
	
	a = ai;
	b = bi;
	c = a;
	fa = FUNCUNI_EVAL(funcuni,a);
	fb = FUNCUNI_EVAL(funcuni,b);
	fc = fa;
	e = b - a;
	d = e;
	
	if (fabs(fc) < fabs(fb)) {
		a = b;
		b = c;
		c = a;
		fa = fb;
		fb = fc;
		fc = fa;
	}
		
	etol = 2 * fd * fabs(b) + tol;
	m = 0.5 * (c - b);
	
	bz = b;
	iter = 0;
	while (fabs ( m ) >= etol && fb != 0.0) {

		iter++;
		
		if (fabs(e) < etol || fabs(fa) <= fabs(fb)) {
			e = m;
			d = e;
		} else {
			
			s = fb/fa;
			if (a == c) {
				// linear interpolation
				p = 2.0 * m * s;
				q = 1.0 - s;
			} else {
				// inverse quadratic interpolation
				q = fa/fc;
				r = fb/fc;
				p = s * (2 * m * q * (q - r) - (b - a) * (r - 1.0));
				q = (q - 1.0) * (r - 1.0) * (s - 1.0);
			}
			
			if (p > 0.0) {
				q = - q;
			} else {
				p = - p;
			}

			s = e;
			e = d;
			
			if ( 2.0 * p < 3.0 * m * q - fabs( etol * q ) && p < fabs( 0.5 * s * q ) ) {
				d = p /q;
			} else {
				e = m;
				d = e;
			}
			
		}
		a = b;
		fa = fb;
		
		if ( fabs(d) > etol ) {
			b += d;
		} else if ( 0.0 < m ) {
			b += etol;
		} else {
			b -= etol;
		}
		
		fb = FUNCUNI_EVAL(funcuni,b);
		
		bz = b;
		if ( ( 0.0 < fb && 0.0 < fc ) || ( fb <= 0.0 && fc <= 0.0 ) ) {
			c = a;
			fc = fa;
			e = b - a;
			d = e;
		}
      
		// To the end of the loop
		
		if (fabs(fc) < fabs(fb)) {
			a = b;
			b = c;
			c = a;
			fa = fb;
			fb = fc;
			fc = fa;
		}
		
		etol = 2 * fd * fabs(b) + tol;
		m = 0.5 * (c - b);
		
	}
	
	return bz;
}